

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

Abc_Obj_t * Abc_SclPerformBufferingOne(Abc_Obj_t *pObj,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  char *pcVar5;
  Abc_Obj_t *pFanLast;
  Abc_Obj_t *pFanThis;
  Abc_Obj_t *pFanPrev;
  int Degree0;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pBuffer;
  Vec_Ptr_t *vFanouts;
  int fVerbose_local;
  int fUseInvs_local;
  int Degree_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjFanoutNum(pObj);
  if (iVar1 <= Degree) {
    __assert_fail("Abc_ObjFanoutNum(pObj) > Degree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0x172,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
  }
  iVar1 = Abc_ObjFanoutNum(pObj);
  vNodes = Vec_PtrAlloc(iVar1);
  Abc_NodeCollectFanouts(pObj,vNodes);
  Vec_PtrSort(vNodes,Abc_NodeCompareLevels);
  if (fUseInvs == 0) {
    pFanout = Abc_NtkCreateNodeBuf(pObj->pNtk,(Abc_Obj_t *)0x0);
  }
  else {
    pFanout = Abc_NtkCreateNodeInv(pObj->pNtk,(Abc_Obj_t *)0x0);
  }
  iVar1 = Vec_PtrSize(vNodes);
  fVerbose_local = Degree;
  if (SBORROW4(iVar1,Degree * 2) != iVar1 + Degree * -2 < 0) {
    iVar1 = Vec_PtrSize(vNodes);
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,(iVar1 + -1) - Degree);
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,Degree + -1);
    pObj_01 = (Abc_Obj_t *)Vec_PtrEntryLast(vNodes);
    iVar1 = Abc_ObjLevel(pObj_00);
    iVar2 = Abc_ObjLevel(pObj_01);
    if (iVar1 == iVar2) {
      iVar1 = Abc_ObjLevel(pAVar4);
      iVar2 = Abc_ObjLevel(pObj_00);
      if (iVar1 < iVar2) {
        for (pFanPrev._4_4_ = 0; iVar1 = Vec_PtrSize(vNodes), pFanPrev._4_4_ < iVar1;
            pFanPrev._4_4_ = pFanPrev._4_4_ + 1) {
          pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,pFanPrev._4_4_);
          iVar1 = Abc_ObjLevel(pAVar4);
          iVar2 = Abc_ObjLevel(pObj_01);
          if (iVar1 == iVar2) break;
        }
        iVar1 = Vec_PtrSize(vNodes);
        if (iVar1 <= pFanPrev._4_4_) {
          __assert_fail("i < Vec_PtrSize(vFanouts)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                        ,0x189,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
        }
        if (1 < pFanPrev._4_4_) {
          fVerbose_local = pFanPrev._4_4_;
        }
      }
    }
    if ((fVerbose_local == Degree) &&
       (iVar1 = Vec_PtrSize(vNodes), iVar1 - fVerbose_local < fVerbose_local)) {
      iVar1 = Vec_PtrSize(vNodes);
      uVar3 = Vec_PtrSize(vNodes);
      fVerbose_local = iVar1 / 2 + (uVar3 & 1);
    }
    if (Degree < fVerbose_local) {
      __assert_fail("Degree <= Degree0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                    ,400,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
    }
  }
  for (pFanPrev._4_4_ = 0; pFanPrev._4_4_ < fVerbose_local; pFanPrev._4_4_ = pFanPrev._4_4_ + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,pFanPrev._4_4_);
    Abc_ObjPatchFanin(pAVar4,pObj,pFanout);
  }
  if (fVerbose != 0) {
    uVar3 = Abc_ObjId(pObj);
    printf("%5d : ",(ulong)uVar3);
    for (pFanPrev._4_4_ = 0; iVar1 = Vec_PtrSize(vNodes), pFanPrev._4_4_ < iVar1;
        pFanPrev._4_4_ = pFanPrev._4_4_ + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,pFanPrev._4_4_);
      uVar3 = Abc_ObjLevel(pAVar4);
      pcVar5 = "";
      if (pFanPrev._4_4_ == fVerbose_local + -1) {
        pcVar5 = "  ";
      }
      printf("%d%s ",(ulong)uVar3,pcVar5);
    }
    printf("\n");
  }
  Vec_PtrFree(vNodes);
  Abc_ObjAddFanin(pFanout,pObj);
  iVar1 = Abc_SclComputeReverseLevel(pFanout);
  *(uint *)&pFanout->field_0x14 = *(uint *)&pFanout->field_0x14 & 0xfff | iVar1 << 0xc;
  if (fUseInvs != 0) {
    Abc_NodeInvUpdateFanPolarity(pFanout);
  }
  return pFanout;
}

Assistant:

Abc_Obj_t * Abc_SclPerformBufferingOne( Abc_Obj_t * pObj, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pBuffer, * pFanout;
    int i, Degree0 = Degree;
    assert( Abc_ObjFanoutNum(pObj) > Degree );
    // collect fanouts and sort by reverse level
    vFanouts = Vec_PtrAlloc( Abc_ObjFanoutNum(pObj) );
    Abc_NodeCollectFanouts( pObj, vFanouts );
    Vec_PtrSort( vFanouts, (int (*)(void))Abc_NodeCompareLevels );
    // select the first Degree fanouts
    if ( fUseInvs )
        pBuffer = Abc_NtkCreateNodeInv( pObj->pNtk, NULL );
    else
        pBuffer = Abc_NtkCreateNodeBuf( pObj->pNtk, NULL );
    // check if it is possible to not increase level
    if ( Vec_PtrSize(vFanouts) < 2 * Degree )
    {
        Abc_Obj_t * pFanPrev = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, Vec_PtrSize(vFanouts)-1-Degree);
        Abc_Obj_t * pFanThis = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, Degree-1);
        Abc_Obj_t * pFanLast = (Abc_Obj_t *)Vec_PtrEntryLast(vFanouts);
        if ( Abc_ObjLevel(pFanThis) == Abc_ObjLevel(pFanLast) &&
             Abc_ObjLevel(pFanPrev) <  Abc_ObjLevel(pFanThis) )
        {
            // find the first one whose level is the same as last
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
                if ( Abc_ObjLevel(pFanout) == Abc_ObjLevel(pFanLast) )
                    break;
            assert( i < Vec_PtrSize(vFanouts) );
            if ( i > 1 )
                Degree = i;
        }
        // make the last two more well-balanced
        if ( Degree == Degree0 && Degree > Vec_PtrSize(vFanouts) - Degree )
            Degree = Vec_PtrSize(vFanouts)/2 + (Vec_PtrSize(vFanouts) & 1);
        assert( Degree <= Degree0 );
    }
    // select fanouts
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, i, Degree )
        Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
    if ( fVerbose )
    {
        printf( "%5d : ", Abc_ObjId(pObj) );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
            printf( "%d%s ", Abc_ObjLevel(pFanout), i == Degree-1 ? "  " : "" );
        printf( "\n" );
    }
    Vec_PtrFree( vFanouts );
    Abc_ObjAddFanin( pBuffer, pObj );
    pBuffer->Level = Abc_SclComputeReverseLevel( pBuffer );
    if ( fUseInvs )
        Abc_NodeInvUpdateFanPolarity( pBuffer );
    return pBuffer;
}